

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

void history_def_clear(void *p,HistEvent *ev)

{
  hentry_t_conflict *in_RDX;
  hentry_t_conflict *extraout_RDX;
  
  while (*(HistEvent **)((long)p + 0x20) != (HistEvent *)p) {
    history_def_delete((history_t *)p,*(HistEvent **)((long)p + 0x20),in_RDX);
    in_RDX = extraout_RDX;
  }
  *(void **)((long)p + 0x28) = p;
  *(undefined8 *)((long)p + 0x34) = 0;
  return;
}

Assistant:

static void
history_def_clear(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	while (h->list.prev != &h->list)
		history_def_delete(h, ev, h->list.prev);
	h->cursor = &h->list;
	h->eventid = 0;
	h->cur = 0;
}